

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<33U,_unsigned_char,_unsigned_int,_int>::prevector
          (prevector<33U,_unsigned_char,_unsigned_int,_int> *this,size_type n,uchar *val)

{
  long lVar1;
  uint uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&this->_union + 0x10) = 0;
  *(undefined8 *)((long)&this->_union + 0x18) = 0;
  (this->_union).indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&this->_union + 8) = 0;
  (this->_union).direct[0x20] = '\0';
  this->_size = 0;
  change_capacity(this,n);
  uVar2 = this->_size + n;
  this->_size = uVar2;
  if (n == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    if (0x21 < uVar2) {
      this = (prevector<33U,_unsigned_char,_unsigned_int,_int> *)
             (this->_union).indirect_contents.indirect;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      memset(this,(uint)*val,(ulong)n);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

explicit prevector(size_type n, const T& val) {
        change_capacity(n);
        _size += n;
        fill(item_ptr(0), n, val);
    }